

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

int NULLC::StrNEqual(NULLCArray a,NULLCArray b)

{
  uint uVar1;
  
  uVar1 = StrEqual(a,b);
  return uVar1 ^ 1;
}

Assistant:

int NULLC::StrNEqual(NULLCArray a, NULLCArray b)
{
	return !StrEqual(a, b);
}